

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.h
# Opt level: O1

int mk_iov_add(mk_iov *mk_io,void *buf,int len,int free)

{
  int iVar1;
  iovec *piVar2;
  int iVar3;
  
  piVar2 = mk_io->io;
  iVar1 = mk_io->iov_idx;
  piVar2[iVar1].iov_base = buf;
  piVar2[iVar1].iov_len = (long)len;
  mk_io->iov_idx = iVar1 + 1;
  mk_io->total_len = mk_io->total_len + (long)len;
  if (free == 1) {
    iVar3 = mk_io->buf_idx;
    mk_io->buf_to_free[iVar3] = buf;
    mk_io->buf_idx = iVar3 + 1;
  }
  iVar3 = -1;
  if (iVar1 < mk_io->size) {
    iVar3 = iVar1 + 1;
  }
  return iVar3;
}

Assistant:

static inline int mk_iov_add(struct mk_iov *mk_io, void *buf, int len,
                             int free)
{
    mk_io->io[mk_io->iov_idx].iov_base = (unsigned char *) buf;
    mk_io->io[mk_io->iov_idx].iov_len = len;
    mk_io->iov_idx++;
    mk_io->total_len += len;

    if (free == MK_TRUE) {
        _mk_iov_set_free(mk_io, buf);
    }

    if (mk_io->iov_idx > mk_io->size) {
        MK_TRACE("[iov] buffer without space");
        return -1;
    }

    return mk_io->iov_idx;
}